

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O2

void __thiscall
checkqueue_tests::test_CheckQueueControl_Locks::test_method(test_CheckQueueControl_Locks *this)

{
  long lVar1;
  pointer __last;
  size_type sVar2;
  pointer __result;
  thread *ptVar3;
  pointer ptVar4;
  thread *ptVar5;
  anon_class_24_3_8803dd74_for__M_head_impl *extraout_RDX;
  anon_class_24_3_8803dd74_for__M_head_impl *__args;
  anon_class_24_3_8803dd74_for__M_head_impl *extraout_RDX_00;
  anon_class_24_3_8803dd74_for__M_head_impl *__args_00;
  anon_class_24_3_8803dd74_for__M_head_impl *extraout_RDX_01;
  anon_class_56_7_0ebc48f7_for__M_head_impl *__args_01;
  thread *thread;
  pointer ptVar6;
  int x;
  uint uVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  atomic<int> *paVar9;
  long lVar10;
  long in_FS_OFFSET;
  bool bVar11;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  assertion_result *paVar12;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  assertion_result local_170;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  undefined1 local_138 [16];
  atomic<int> *local_128;
  condition_variable *local_120;
  bool *local_118;
  bool *local_110;
  bool *local_108;
  bool done_ack;
  bool done;
  bool has_tried;
  bool has_lock;
  atomic<int> nThreads;
  atomic<int> fails;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  __single_object queue;
  unique_lock<std::mutex> l;
  vector<std::thread,_std::allocator<std::thread>_> tg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<CCheckQueue<FakeCheck>,unsigned_int_const&,int_const&>
            ((uint *)&queue,(int *)&QUEUE_BATCH_SIZE);
  tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  _nThreads = _nThreads & 0xffffffff00000000;
  _fails = (pointer)((ulong)_fails & 0xffffffff00000000);
  lVar10 = 3;
  __args = extraout_RDX;
  while( true ) {
    ptVar4 = tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar11 = lVar10 == 0;
    lVar10 = lVar10 + -1;
    ptVar6 = tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (bVar11) break;
    local_138._8_8_ = &nThreads;
    local_128 = &fails;
    if (tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_138._0_8_ = &queue;
      sVar2 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                        (&tg,1,"vector::_M_realloc_insert");
      __last = tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar6 = tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      __result = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                           (&tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>,sVar2)
      ;
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,checkqueue_tests::test_CheckQueueControl_Locks::test_method()::__0>
                ((allocator_type *)(((long)ptVar4 - (long)ptVar6) + (long)__result),
                 (thread *)local_138,__args_00);
      ptVar3 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar6,ptVar4,__result,(allocator<std::thread> *)&tg);
      ptVar3 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar4,__last,ptVar3 + 1,(allocator<std::thread> *)&tg);
      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&tg,ptVar6,
                 (long)tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage - (long)ptVar6 >> 3);
      tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = __result + sVar2;
      __args = extraout_RDX_01;
      tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = __result;
      tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = ptVar3;
    }
    else {
      local_138._0_8_ = &queue;
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,checkqueue_tests::test_CheckQueueControl_Locks::test_method()::__0>
                ((allocator_type *)
                 tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,(thread *)local_138,__args);
      __args = extraout_RDX_00;
      tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish =
           tg.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  for (; ptVar6 != ptVar4; ptVar6 = ptVar6 + 1) {
    if ((ptVar6->_M_id)._M_thread != 0) {
      std::thread::join();
    }
  }
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x17a;
  file.m_begin = (iterator)&local_90;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_a0,msg);
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._0_8_ = &PTR__lazy_ostream_01139f30;
  local_128 = (atomic<int> *)boost::unit_test::lazy_ostream::inst;
  local_120 = (condition_variable *)0xc694e1;
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
  ;
  local_a8 = "";
  paVar12 = &local_170;
  local_170.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_170._1_3_ = 0;
  paVar9 = &fails;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::atomic<int>,int>
            (local_138,&local_b0,0x17a);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&tg);
  _fails = (thread *)0x0;
  _nThreads = 0;
  std::condition_variable::condition_variable((condition_variable *)&tg);
  has_lock = false;
  has_tried = false;
  done = false;
  done_ack = false;
  std::unique_lock<std::mutex>::unique_lock(&l,(mutex_type *)&nThreads);
  local_128 = (atomic<int> *)&has_lock;
  local_118 = &has_tried;
  local_110 = &done;
  local_108 = &done_ack;
  local_138._0_8_ = &queue;
  local_138._8_8_ = (mutex_type *)&nThreads;
  local_120 = (condition_variable *)&tg;
  sVar2 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                    ((vector<std::thread,_std::allocator<std::thread>_> *)&fails,1,
                     "vector::_M_realloc_insert");
  ptVar3 = _fails;
  ptVar4 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                     ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&fails,sVar2);
  std::allocator_traits<std::allocator<std::thread>>::
  construct<std::thread,checkqueue_tests::test_CheckQueueControl_Locks::test_method()::__1>
            ((allocator_type *)((long)ptVar4 - (long)ptVar3),(thread *)local_138,__args_01);
  ptVar5 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                     (ptVar3,(thread *)0x0,ptVar4,(allocator<std::thread> *)&fails);
  ptVar5 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                     ((thread *)0x0,(thread *)0x0,ptVar5 + 1,(allocator<std::thread> *)&fails);
  std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
            ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&fails,ptVar3,
             -(long)ptVar3 >> 3);
  _fails = ptVar4;
  while (has_lock != true) {
    std::condition_variable::wait((unique_lock *)&tg);
  }
  bVar11 = false;
  for (uVar7 = 0; (bVar11 == false && (uVar7 < 100)); uVar7 = uVar7 + 1) {
    bVar11 = std::mutex::try_lock
                       ((mutex *)((long)queue._M_t.
                                        super___uniq_ptr_impl<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_CCheckQueue<FakeCheck>_*,_std::default_delete<CCheckQueue<FakeCheck>_>_>
                                        .super__Head_base<0UL,_CCheckQueue<FakeCheck>_*,_false>.
                                        _M_head_impl + 0xd8));
  }
  has_tried = true;
  std::condition_variable::notify_one();
  while (done == false) {
    std::condition_variable::wait((unique_lock *)&tg);
  }
  done_ack = true;
  std::condition_variable::notify_one();
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)paVar9;
  msg_00.m_begin = pvVar8;
  file_00.m_end = (iterator)0x19e;
  file_00.m_begin = (iterator)&local_148;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_158,
             msg_00);
  local_170._0_4_ = CONCAT31(local_170._1_3_,~bVar11) & 0xffffff01;
  local_170.m_message.px = (element_type *)0x0;
  local_170.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120 = (condition_variable *)&local_180;
  local_180 = "!fails";
  local_178 = "";
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._0_8_ = &PTR__lazy_ostream_0113a070;
  local_128 = (atomic<int> *)boost::unit_test::lazy_ostream::inst;
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
  ;
  local_188 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_170,(lazy_ostream *)local_138,2,0,WARN,(check_type)paVar12,(size_t)&local_190,
             0x19e);
  boost::detail::shared_count::~shared_count(&local_170.m_message.pn);
  std::unique_lock<std::mutex>::~unique_lock(&l);
  for (ptVar4 = _fails; ptVar4 != ptVar5; ptVar4 = ptVar4 + 1) {
    if ((ptVar4->_M_id)._M_thread != 0) {
      std::thread::join();
    }
  }
  std::condition_variable::~condition_variable((condition_variable *)&tg);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&fails);
  std::unique_ptr<CCheckQueue<FakeCheck>,_std::default_delete<CCheckQueue<FakeCheck>_>_>::
  ~unique_ptr(&queue);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueueControl_Locks)
{
    auto queue = std::make_unique<Standard_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    {
        std::vector<std::thread> tg;
        std::atomic<int> nThreads {0};
        std::atomic<int> fails {0};
        for (size_t i = 0; i < 3; ++i) {
            tg.emplace_back(
                    [&]{
                    CCheckQueueControl<FakeCheck> control(queue.get());
                    // While sleeping, no other thread should execute to this point
                    auto observed = ++nThreads;
                    UninterruptibleSleep(std::chrono::milliseconds{10});
                    fails += observed  != nThreads;
                    });
        }
        for (auto& thread: tg) {
            if (thread.joinable()) thread.join();
        }
        BOOST_REQUIRE_EQUAL(fails, 0);
    }
    {
        std::vector<std::thread> tg;
        std::mutex m;
        std::condition_variable cv;
        bool has_lock{false};
        bool has_tried{false};
        bool done{false};
        bool done_ack{false};
        {
            std::unique_lock<std::mutex> l(m);
            tg.emplace_back([&]{
                    CCheckQueueControl<FakeCheck> control(queue.get());
                    std::unique_lock<std::mutex> ll(m);
                    has_lock = true;
                    cv.notify_one();
                    cv.wait(ll, [&]{return has_tried;});
                    done = true;
                    cv.notify_one();
                    // Wait until the done is acknowledged
                    //
                    cv.wait(ll, [&]{return done_ack;});
                    });
            // Wait for thread to get the lock
            cv.wait(l, [&](){return has_lock;});
            bool fails = false;
            for (auto x = 0; x < 100 && !fails; ++x) {
                fails = queue->m_control_mutex.try_lock();
            }
            has_tried = true;
            cv.notify_one();
            cv.wait(l, [&](){return done;});
            // Acknowledge the done
            done_ack = true;
            cv.notify_one();
            BOOST_REQUIRE(!fails);
        }
        for (auto& thread: tg) {
            if (thread.joinable()) thread.join();
        }
    }
}